

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O1

gc_heap_ptr<mjs::global_object> mjs::global_object::make(gc_heap *h,version ver,bool *strict_mode)

{
  global_object_impl *this;
  undefined8 extraout_RDX;
  undefined4 in_register_00000034;
  gc_heap_ptr<mjs::global_object> gVar1;
  gc_heap_ptr<mjs::global_object_impl> global;
  undefined1 local_28 [20];
  undefined4 local_14;
  
  local_14 = SUB84(strict_mode,0);
  gc_heap::allocate_and_construct<mjs::global_object_impl,mjs::gc_heap&,mjs::version&,bool&>
            ((gc_heap *)local_28,CONCAT44(in_register_00000034,ver),(gc_heap *)0xb8,
             (version *)CONCAT44(in_register_00000034,ver),(bool *)&local_14);
  this = (global_object_impl *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_28);
  global_object_impl::popuplate_global(this);
  (h->pointers_).set_ = (gc_heap_ptr_untyped **)local_28._0_8_;
  (h->pointers_).capacity_ = local_28._8_4_;
  if ((gc_heap *)local_28._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_28._0_8_,(gc_heap_ptr_untyped *)h);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_28);
  gVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  gVar1.super_gc_heap_ptr_untyped.heap_ = h;
  return (gc_heap_ptr<mjs::global_object>)gVar1.super_gc_heap_ptr_untyped;
}

Assistant:

gc_heap_ptr<global_object> global_object::make(gc_heap& h, version ver, bool& strict_mode) {
    auto global = h.make<global_object_impl>(h, ver, strict_mode);
    global->popuplate_global(); // Populate here so the self_ptr() won't fail the assert
    return global;
}